

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O2

long __thiscall AmsRouter::GetLocalAddress(AmsRouter *this,uint16_t port,AmsAddr *pAddr)

{
  bool bVar1;
  long lVar2;
  
  std::recursive_mutex::lock(&this->mutex);
  lVar2 = 0x748;
  if (0xff7f < (ushort)(port + 0x8a50)) {
    bVar1 = AmsPort::IsOpen((AmsPort *)(&(this->ports).field_0x0 + (ulong)(port - 30000) * 0x60));
    if (bVar1) {
      *(undefined2 *)((pAddr->netId).b + 4) = *(undefined2 *)((this->localAddr).b + 4);
      *(undefined4 *)(pAddr->netId).b = *(undefined4 *)(this->localAddr).b;
      pAddr->port = port;
      lVar2 = 0;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return lVar2;
}

Assistant:

long AmsRouter::GetLocalAddress(uint16_t port, AmsAddr* pAddr)
{
    std::lock_guard<std::recursive_mutex> lock(mutex);
    if ((port < PORT_BASE) || (port >= PORT_BASE + NUM_PORTS_MAX)) {
        return ADSERR_CLIENT_PORTNOTOPEN;
    }

    if (ports[port - PORT_BASE].IsOpen()) {
        memcpy(&pAddr->netId, &localAddr, sizeof(localAddr));
        pAddr->port = port;
        return 0;
    }
    return ADSERR_CLIENT_PORTNOTOPEN;
}